

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

void erase_pending_event(cio_eventloop *loop,cio_event_notifier *evn)

{
  uint uVar1;
  uint local_1c;
  uint i;
  cio_event_notifier *evn_local;
  cio_eventloop *loop_local;
  
  local_1c = loop->event_counter;
  do {
    uVar1 = local_1c;
    local_1c = uVar1 + 1;
    if (loop->num_events <= local_1c) {
      return;
    }
  } while ((cio_event_notifier *)loop->epoll_events[local_1c].data.ptr != evn);
  memmove(loop->epoll_events + local_1c,loop->epoll_events + (uVar1 + 2),
          (ulong)(loop->num_events - (uVar1 + 2)) * 0xc);
  loop->num_events = loop->num_events - 1;
  return;
}

Assistant:

static void erase_pending_event(struct cio_eventloop *loop, const struct cio_event_notifier *evn)
{
	for (unsigned int i = loop->event_counter + 1; i < loop->num_events; i++) {
		if (loop->epoll_events[i].data.ptr == evn) {
			memmove(&loop->epoll_events[i], &loop->epoll_events[i + 1], (loop->num_events - (i + 1)) * sizeof(loop->epoll_events[0]));
			loop->num_events--;
			break;
		}
	}
}